

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O1

int Potassco::xconvert(char *x,longlong *out,char **errPos,int param_4)

{
  bool bVar1;
  char *local_10;
  
  local_10 = x;
  bVar1 = parseSigned(&local_10,out,-0x8000000000000000,0x7fffffffffffffff);
  if (errPos != (char **)0x0) {
    *errPos = local_10;
  }
  return (int)bVar1;
}

Assistant:

int xconvert(const char* x, long long& out, const char** errPos, int) {
	int tok = parseSigned(x, out, LLONG_MIN, LLONG_MAX);
	return parsed(tok, x, errPos);
}